

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O2

bool __thiscall MeCab::Dictionary::isCompatible(Dictionary *this,Dictionary *d)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (this->version_ == d->version_) {
    if ((this->lsize_ == d->lsize_) && (this->rsize_ == d->rsize_)) {
      iVar1 = decode_charset(this->charset_);
      iVar2 = decode_charset(d->charset_);
      bVar3 = iVar1 == iVar2;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool isCompatible(const Dictionary &d) const {
    return(version_ == d.version_ &&
           lsize_  == d.lsize_   &&
           rsize_  == d.rsize_   &&
           decode_charset(charset_) ==
           decode_charset(d.charset_));
  }